

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx::ConeCurveMiMBIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  bool bVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar61;
  float fVar62;
  float fVar70;
  float fVar72;
  float fVar74;
  undefined1 auVar63 [16];
  float fVar71;
  float fVar73;
  float fVar75;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar101;
  float fVar104;
  float fVar105;
  undefined1 auVar102 [16];
  float fVar106;
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [64];
  float fVar140;
  float fVar141;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar148;
  float fVar150;
  undefined1 auVar145 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar157 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar177;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [8];
  float fStack_3c8;
  float fStack_3c4;
  RTCFilterFunctionNArguments local_3c0;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  Primitive *local_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined1 local_2f0 [16];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float local_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [8];
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar7 = context->scene;
  uVar40 = line->sharedGeomID;
  uVar41 = (line->v0).field_0.i[0];
  pGVar8 = (pSVar7->geometries).items[uVar40].ptr;
  fVar168 = (pGVar8->time_range).lower;
  fVar168 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar168) / ((pGVar8->time_range).upper - fVar168));
  auVar49 = vroundss_avx(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),9);
  auVar49 = vminss_avx(auVar49,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar120 = vmaxss_avx(ZEXT816(0),auVar49);
  lVar43 = *(long *)&pGVar8[3].time_range.upper;
  lVar44 = (long)(int)auVar120._0_4_ * 0x38;
  lVar9 = *(long *)(lVar43 + lVar44);
  lVar10 = *(long *)(lVar43 + 0x10 + lVar44);
  auVar49 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)uVar41);
  uVar4 = (line->v0).field_0.i[1];
  auVar86 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)uVar4);
  uVar5 = (line->v0).field_0.i[2];
  auVar77 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)uVar5);
  uVar6 = (line->v0).field_0.i[3];
  auVar50 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)uVar6);
  auVar63 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)(uVar41 + 1));
  auVar79 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)(uVar4 + 1));
  auVar48 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)(uVar5 + 1));
  auVar51 = *(undefined1 (*) [16])(lVar9 + lVar10 * (ulong)(uVar6 + 1));
  lVar9 = *(long *)(lVar43 + 0x38 + lVar44);
  lVar43 = *(long *)(lVar43 + 0x48 + lVar44);
  auVar52 = *(undefined1 (*) [16])(lVar9 + (ulong)uVar41 * lVar43);
  auVar76 = *(undefined1 (*) [16])(lVar9 + (ulong)uVar4 * lVar43);
  auVar78 = *(undefined1 (*) [16])(lVar9 + (ulong)uVar5 * lVar43);
  auVar84 = *(undefined1 (*) [16])(lVar9 + (ulong)uVar6 * lVar43);
  auVar85 = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar41 + 1) * lVar43);
  auVar102 = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar5 + 1) * lVar43);
  fVar168 = fVar168 - auVar120._0_4_;
  auVar120 = vunpcklps_avx(auVar49,auVar77);
  auVar49 = vunpckhps_avx(auVar49,auVar77);
  auVar77 = vunpcklps_avx(auVar86,auVar50);
  auVar86 = vunpckhps_avx(auVar86,auVar50);
  auVar107 = vunpcklps_avx(auVar120,auVar77);
  auVar77 = vunpckhps_avx(auVar120,auVar77);
  auVar120 = vunpcklps_avx(auVar49,auVar86);
  auVar50 = vunpckhps_avx(auVar49,auVar86);
  auVar121 = vunpcklps_avx(auVar63,auVar48);
  auVar49 = vunpckhps_avx(auVar63,auVar48);
  auVar63 = vunpcklps_avx(auVar79,auVar51);
  auVar86 = vunpckhps_avx(auVar79,auVar51);
  auVar122 = vunpcklps_avx(auVar121,auVar63);
  auVar63 = vunpckhps_avx(auVar121,auVar63);
  auVar121 = vunpcklps_avx(auVar49,auVar86);
  auVar79 = vunpckhps_avx(auVar49,auVar86);
  auVar48 = vunpcklps_avx(auVar52,auVar78);
  auVar49 = vunpckhps_avx(auVar52,auVar78);
  auVar51 = vunpcklps_avx(auVar76,auVar84);
  auVar86 = vunpckhps_avx(auVar76,auVar84);
  auVar78 = vunpcklps_avx(auVar48,auVar51);
  auVar48 = vunpckhps_avx(auVar48,auVar51);
  auVar84 = vunpcklps_avx(auVar49,auVar86);
  auVar51 = vunpckhps_avx(auVar49,auVar86);
  auVar76 = vunpcklps_avx(auVar85,auVar102);
  auVar52 = vunpckhps_avx(auVar85,auVar102);
  auVar49 = *(undefined1 (*) [16])(lVar9 + (ulong)(uVar4 + 1) * lVar43);
  auVar86 = *(undefined1 (*) [16])(lVar9 + lVar43 * (ulong)(uVar6 + 1));
  auVar85 = vunpcklps_avx(auVar49,auVar86);
  auVar49 = vunpckhps_avx(auVar49,auVar86);
  auVar102 = vunpcklps_avx(auVar76,auVar85);
  auVar76 = vunpckhps_avx(auVar76,auVar85);
  auVar85 = vunpcklps_avx(auVar52,auVar49);
  auVar52 = vunpckhps_avx(auVar52,auVar49);
  auVar49 = vshufps_avx(ZEXT416((uint)fVar168),ZEXT416((uint)fVar168),0);
  auVar86 = vshufps_avx(ZEXT416((uint)(1.0 - fVar168)),ZEXT416((uint)(1.0 - fVar168)),0);
  fVar168 = auVar49._0_4_;
  fVar169 = auVar49._4_4_;
  fVar170 = auVar49._8_4_;
  fVar61 = auVar49._12_4_;
  fVar70 = auVar86._0_4_;
  fVar72 = auVar86._4_4_;
  fVar74 = auVar86._8_4_;
  fVar177 = auVar86._12_4_;
  fVar89 = fVar70 * auVar107._0_4_ + fVar168 * auVar78._0_4_;
  fVar98 = fVar72 * auVar107._4_4_ + fVar169 * auVar78._4_4_;
  fVar99 = fVar74 * auVar107._8_4_ + fVar170 * auVar78._8_4_;
  fVar100 = fVar177 * auVar107._12_4_ + fVar61 * auVar78._12_4_;
  auVar107._0_4_ = fVar70 * auVar77._0_4_ + fVar168 * auVar48._0_4_;
  auVar107._4_4_ = fVar72 * auVar77._4_4_ + fVar169 * auVar48._4_4_;
  auVar107._8_4_ = fVar74 * auVar77._8_4_ + fVar170 * auVar48._8_4_;
  auVar107._12_4_ = fVar177 * auVar77._12_4_ + fVar61 * auVar48._12_4_;
  local_420._0_4_ = auVar120._0_4_;
  local_420._4_4_ = auVar120._4_4_;
  fStack_418 = auVar120._8_4_;
  fStack_414 = auVar120._12_4_;
  local_420._0_4_ = fVar70 * (float)local_420._0_4_ + fVar168 * auVar84._0_4_;
  local_420._4_4_ = fVar72 * (float)local_420._4_4_ + fVar169 * auVar84._4_4_;
  fStack_418 = fVar74 * fStack_418 + fVar170 * auVar84._8_4_;
  fStack_414 = fVar177 * fStack_414 + fVar61 * auVar84._12_4_;
  auVar157._8_4_ = 0x3f800000;
  auVar157._0_8_ = &DAT_3f8000003f800000;
  auVar157._12_4_ = 0x3f800000;
  local_460._0_4_ = auVar50._0_4_;
  local_460._4_4_ = auVar50._4_4_;
  fStack_458 = auVar50._8_4_;
  fStack_454 = auVar50._12_4_;
  local_460._0_4_ = fVar70 * (float)local_460._0_4_ + fVar168 * auVar51._0_4_;
  local_460._4_4_ = fVar72 * (float)local_460._4_4_ + fVar169 * auVar51._4_4_;
  fStack_458 = fVar74 * fStack_458 + fVar170 * auVar51._8_4_;
  fStack_454 = fVar177 * fStack_454 + fVar61 * auVar51._12_4_;
  local_3d0._0_4_ = fVar70 * auVar122._0_4_ + fVar168 * auVar102._0_4_;
  local_3d0._4_4_ = fVar72 * auVar122._4_4_ + fVar169 * auVar102._4_4_;
  fStack_3c8 = fVar74 * auVar122._8_4_ + fVar170 * auVar102._8_4_;
  fStack_3c4 = fVar177 * auVar122._12_4_ + fVar61 * auVar102._12_4_;
  auVar154._0_4_ = fVar70 * auVar63._0_4_ + fVar168 * auVar76._0_4_;
  auVar154._4_4_ = fVar72 * auVar63._4_4_ + fVar169 * auVar76._4_4_;
  auVar154._8_4_ = fVar74 * auVar63._8_4_ + fVar170 * auVar76._8_4_;
  auVar154._12_4_ = fVar177 * auVar63._12_4_ + fVar61 * auVar76._12_4_;
  auVar145._0_4_ = fVar70 * auVar121._0_4_ + fVar168 * auVar85._0_4_;
  auVar145._4_4_ = fVar72 * auVar121._4_4_ + fVar169 * auVar85._4_4_;
  auVar145._8_4_ = fVar74 * auVar121._8_4_ + fVar170 * auVar85._8_4_;
  auVar145._12_4_ = fVar177 * auVar121._12_4_ + fVar61 * auVar85._12_4_;
  local_4a0 = auVar79._0_4_;
  fStack_49c = auVar79._4_4_;
  fStack_498 = auVar79._8_4_;
  fStack_494 = auVar79._12_4_;
  auVar48._0_4_ = fVar70 * local_4a0 + fVar168 * auVar52._0_4_;
  auVar48._4_4_ = fVar72 * fStack_49c + fVar169 * auVar52._4_4_;
  auVar48._8_4_ = fVar74 * fStack_498 + fVar170 * auVar52._8_4_;
  auVar48._12_4_ = fVar177 * fStack_494 + fVar61 * auVar52._12_4_;
  auVar49 = vpcmpeqd_avx(auVar48,auVar48);
  auVar86 = vpcmpeqd_avx(auVar49,(undefined1  [16])(line->primIDs).field_0);
  local_210 = vshufps_avx(ZEXT416(uVar40),ZEXT416(uVar40),0);
  fVar168 = *(float *)(ray + k * 4 + 0x80);
  fVar169 = *(float *)(ray + k * 4 + 0xa0);
  fVar170 = *(float *)(ray + k * 4 + 0xc0);
  auVar49 = ZEXT416((uint)(fVar168 * fVar168 + fVar169 * fVar169 + fVar170 * fVar170));
  auVar77 = vshufps_avx(auVar49,auVar49,0);
  auVar49 = vrcpps_avx(auVar77);
  fVar61 = auVar49._0_4_;
  auVar50._0_4_ = fVar61 * auVar77._0_4_;
  fVar70 = auVar49._4_4_;
  auVar50._4_4_ = fVar70 * auVar77._4_4_;
  fVar72 = auVar49._8_4_;
  auVar50._8_4_ = fVar72 * auVar77._8_4_;
  fVar74 = auVar49._12_4_;
  auVar50._12_4_ = fVar74 * auVar77._12_4_;
  auVar49 = vsubps_avx(auVar157,auVar50);
  auVar79._4_4_ = fVar98;
  auVar79._0_4_ = fVar89;
  auVar79._8_4_ = fVar99;
  auVar79._12_4_ = fVar100;
  auVar63._0_4_ = (fVar89 + (float)local_3d0._0_4_) * 0.5;
  auVar63._4_4_ = (fVar98 + (float)local_3d0._4_4_) * 0.5;
  auVar63._8_4_ = (fVar99 + fStack_3c8) * 0.5;
  auVar63._12_4_ = (fVar100 + fStack_3c4) * 0.5;
  auVar84._0_4_ = (auVar154._0_4_ + auVar107._0_4_) * 0.5;
  auVar84._4_4_ = (auVar154._4_4_ + auVar107._4_4_) * 0.5;
  auVar84._8_4_ = (auVar154._8_4_ + auVar107._8_4_) * 0.5;
  auVar84._12_4_ = (auVar154._12_4_ + auVar107._12_4_) * 0.5;
  auVar76._0_4_ = (auVar145._0_4_ + (float)local_420._0_4_) * 0.5;
  auVar76._4_4_ = (auVar145._4_4_ + (float)local_420._4_4_) * 0.5;
  auVar76._8_4_ = (auVar145._8_4_ + fStack_418) * 0.5;
  auVar76._12_4_ = (auVar145._12_4_ + fStack_414) * 0.5;
  fVar89 = *(float *)(ray + k * 4 + 0x20);
  auVar102._4_4_ = fVar89;
  auVar102._0_4_ = fVar89;
  auVar102._8_4_ = fVar89;
  auVar102._12_4_ = fVar89;
  auVar77 = vsubps_avx(auVar84,auVar102);
  fVar98 = *(float *)(ray + k * 4 + 0x40);
  auVar120._4_4_ = fVar98;
  auVar120._0_4_ = fVar98;
  auVar120._8_4_ = fVar98;
  auVar120._12_4_ = fVar98;
  auVar50 = vsubps_avx(auVar76,auVar120);
  fVar99 = *(float *)(ray + k * 4);
  auVar85._4_4_ = fVar99;
  auVar85._0_4_ = fVar99;
  auVar85._8_4_ = fVar99;
  auVar85._12_4_ = fVar99;
  auVar63 = vsubps_avx(auVar63,auVar85);
  fVar62 = (fVar168 * auVar63._0_4_ + fVar169 * auVar77._0_4_ + fVar170 * auVar50._0_4_) *
           (fVar61 + fVar61 * auVar49._0_4_);
  fVar71 = (fVar168 * auVar63._4_4_ + fVar169 * auVar77._4_4_ + fVar170 * auVar50._4_4_) *
           (fVar70 + fVar70 * auVar49._4_4_);
  fVar73 = (fVar168 * auVar63._8_4_ + fVar169 * auVar77._8_4_ + fVar170 * auVar50._8_4_) *
           (fVar72 + fVar72 * auVar49._8_4_);
  fVar75 = (fVar168 * auVar63._12_4_ + fVar169 * auVar77._12_4_ + fVar170 * auVar50._12_4_) *
           (fVar74 + fVar74 * auVar49._12_4_);
  auVar136._0_4_ = fVar99 + fVar168 * fVar62;
  auVar136._4_4_ = fVar99 + fVar168 * fVar71;
  auVar136._8_4_ = fVar99 + fVar168 * fVar73;
  auVar136._12_4_ = fVar99 + fVar168 * fVar75;
  auVar171._0_4_ = fVar89 + fVar169 * fVar62;
  auVar171._4_4_ = fVar89 + fVar169 * fVar71;
  auVar171._8_4_ = fVar89 + fVar169 * fVar73;
  auVar171._12_4_ = fVar89 + fVar169 * fVar75;
  auVar51._0_4_ = fVar98 + fVar170 * fVar62;
  auVar51._4_4_ = fVar98 + fVar170 * fVar71;
  auVar51._8_4_ = fVar98 + fVar170 * fVar73;
  auVar51._12_4_ = fVar98 + fVar170 * fVar75;
  local_310 = vsubps_avx(auVar154,auVar107);
  local_320 = vsubps_avx(auVar145,_local_420);
  fVar89 = local_320._0_4_;
  fVar74 = local_320._4_4_;
  fVar14 = local_320._8_4_;
  fVar18 = local_320._12_4_;
  fVar98 = local_310._0_4_;
  fVar100 = local_310._4_4_;
  fVar15 = local_310._8_4_;
  fVar19 = local_310._12_4_;
  local_220 = vsubps_avx(_local_3d0,auVar79);
  fVar99 = local_220._0_4_;
  fVar177 = local_220._4_4_;
  fVar16 = local_220._8_4_;
  fVar20 = local_220._12_4_;
  fVar101 = fVar99 * fVar99 + fVar98 * fVar98 + fVar89 * fVar89;
  fVar104 = fVar177 * fVar177 + fVar100 * fVar100 + fVar74 * fVar74;
  fVar105 = fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14;
  fVar106 = fVar20 * fVar20 + fVar19 * fVar19 + fVar18 * fVar18;
  _local_330 = vsubps_avx(auVar171,auVar107);
  _local_340 = vsubps_avx(auVar51,_local_420);
  fVar61 = local_340._0_4_;
  fVar163 = local_340._4_4_;
  fVar165 = local_340._8_4_;
  fVar167 = local_340._12_4_;
  fVar70 = local_330._0_4_;
  fVar140 = local_330._4_4_;
  fVar141 = local_330._8_4_;
  fVar142 = local_330._12_4_;
  auVar49 = vsubps_avx(auVar136,auVar79);
  fVar143 = auVar49._0_4_;
  fVar148 = auVar49._4_4_;
  fVar150 = auVar49._8_4_;
  fVar152 = auVar49._12_4_;
  fVar156 = fVar143 * fVar99 + fVar98 * fVar70 + fVar89 * fVar61;
  fVar158 = fVar148 * fVar177 + fVar100 * fVar140 + fVar74 * fVar163;
  fVar159 = fVar150 * fVar16 + fVar15 * fVar141 + fVar14 * fVar165;
  fVar160 = fVar152 * fVar20 + fVar19 * fVar142 + fVar18 * fVar167;
  auVar155._0_4_ = fVar99 * fVar168 + fVar169 * fVar98 + fVar89 * fVar170;
  auVar155._4_4_ = fVar177 * fVar168 + fVar169 * fVar100 + fVar74 * fVar170;
  auVar155._8_4_ = fVar16 * fVar168 + fVar169 * fVar15 + fVar14 * fVar170;
  auVar155._12_4_ = fVar20 * fVar168 + fVar169 * fVar19 + fVar18 * fVar170;
  auVar49 = vsubps_avx(_local_460,auVar48);
  fVar72 = auVar49._0_4_;
  fVar13 = auVar49._4_4_;
  fVar17 = auVar49._8_4_;
  fVar21 = auVar49._12_4_;
  local_2c0 = fVar72 * fVar72 + fVar101;
  fStack_2bc = fVar13 * fVar13 + fVar104;
  fStack_2b8 = fVar17 * fVar17 + fVar105;
  fStack_2b4 = fVar21 * fVar21 + fVar106;
  local_230._0_4_ = fVar101 * fVar101;
  local_230._4_4_ = fVar104 * fVar104;
  fStack_228 = fVar105 * fVar105;
  fStack_224 = fVar106 * fVar106;
  auVar49._0_4_ = (float)local_230._0_4_ * (fVar143 * fVar168 + fVar169 * fVar70 + fVar170 * fVar61)
  ;
  auVar49._4_4_ =
       (float)local_230._4_4_ * (fVar148 * fVar168 + fVar169 * fVar140 + fVar170 * fVar163);
  auVar49._8_4_ = fStack_228 * (fVar150 * fVar168 + fVar169 * fVar141 + fVar170 * fVar165);
  auVar49._12_4_ = fStack_224 * (fVar152 * fVar168 + fVar169 * fVar142 + fVar170 * fVar167);
  auVar121._0_4_ = local_2c0 * auVar155._0_4_ * fVar156;
  auVar121._4_4_ = fStack_2bc * auVar155._4_4_ * fVar158;
  auVar121._8_4_ = fStack_2b8 * auVar155._8_4_ * fVar159;
  auVar121._12_4_ = fStack_2b4 * auVar155._12_4_ * fVar160;
  auVar49 = vsubps_avx(auVar49,auVar121);
  auVar122._0_4_ = (float)local_460._0_4_ * fVar101;
  auVar122._4_4_ = (float)local_460._4_4_ * fVar104;
  auVar122._8_4_ = fStack_458 * fVar105;
  auVar122._12_4_ = fStack_454 * fVar106;
  auVar52._0_4_ = auVar155._0_4_ * fVar72 * auVar122._0_4_ + auVar49._0_4_;
  auVar52._4_4_ = auVar155._4_4_ * fVar13 * auVar122._4_4_ + auVar49._4_4_;
  auVar52._8_4_ = auVar155._8_4_ * fVar17 * auVar122._8_4_ + auVar49._8_4_;
  auVar52._12_4_ = auVar155._12_4_ * fVar21 * auVar122._12_4_ + auVar49._12_4_;
  auVar77._0_4_ = (float)local_230._0_4_ * (fVar143 * fVar143 + fVar70 * fVar70 + fVar61 * fVar61);
  auVar77._4_4_ =
       (float)local_230._4_4_ * (fVar148 * fVar148 + fVar140 * fVar140 + fVar163 * fVar163);
  auVar77._8_4_ = fStack_228 * (fVar150 * fVar150 + fVar141 * fVar141 + fVar165 * fVar165);
  auVar77._12_4_ = fStack_224 * (fVar152 * fVar152 + fVar142 * fVar142 + fVar167 * fVar167);
  auVar132._0_4_ = fVar156 * fVar156 * local_2c0;
  auVar132._4_4_ = fVar158 * fVar158 * fStack_2bc;
  auVar132._8_4_ = fVar159 * fVar159 * fStack_2b8;
  auVar132._12_4_ = fVar160 * fVar160 * fStack_2b4;
  auVar49 = vsubps_avx(auVar77,auVar132);
  auVar133._0_4_ = (fVar72 + fVar72) * fVar156;
  auVar133._4_4_ = (fVar13 + fVar13) * fVar158;
  auVar133._8_4_ = (fVar17 + fVar17) * fVar159;
  auVar133._12_4_ = (fVar21 + fVar21) * fVar160;
  auVar77 = vsubps_avx(auVar133,auVar122);
  fVar161 = auVar155._0_4_ * auVar155._0_4_;
  fVar162 = auVar155._4_4_ * auVar155._4_4_;
  fVar164 = auVar155._8_4_ * auVar155._8_4_;
  fVar166 = auVar155._12_4_ * auVar155._12_4_;
  auVar123._0_4_ = fVar161 * local_2c0;
  auVar123._4_4_ = fVar162 * fStack_2bc;
  auVar123._8_4_ = fVar164 * fStack_2b8;
  auVar123._12_4_ = fVar166 * fStack_2b4;
  auVar50 = vsubps_avx(_local_230,auVar123);
  auVar78._0_4_ = auVar50._0_4_ * (auVar49._0_4_ + auVar77._0_4_ * auVar122._0_4_);
  auVar78._4_4_ = auVar50._4_4_ * (auVar49._4_4_ + auVar77._4_4_ * auVar122._4_4_);
  auVar78._8_4_ = auVar50._8_4_ * (auVar49._8_4_ + auVar77._8_4_ * auVar122._8_4_);
  auVar78._12_4_ = auVar50._12_4_ * (auVar49._12_4_ + auVar77._12_4_ * auVar122._12_4_);
  auVar134._0_4_ = auVar52._0_4_ * auVar52._0_4_;
  auVar134._4_4_ = auVar52._4_4_ * auVar52._4_4_;
  auVar134._8_4_ = auVar52._8_4_ * auVar52._8_4_;
  auVar134._12_4_ = auVar52._12_4_ * auVar52._12_4_;
  auVar77 = vsubps_avx(auVar134,auVar78);
  auVar79 = ZEXT416(0) << 0x20;
  auVar49 = vcmpps_avx(auVar77,auVar79,5);
  auVar63 = auVar49 & ~auVar86;
  if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar63[0xf] < '\0') {
    auVar63 = vandnps_avx(auVar86,auVar49);
    auVar76 = vsubps_avx(auVar136,_local_3d0);
    auVar78 = vsubps_avx(auVar171,auVar154);
    auVar51 = vsubps_avx(auVar51,auVar145);
    auVar86 = vsqrtps_avx(auVar77);
    auVar49 = vrcpps_avx(auVar50);
    fVar144 = auVar49._0_4_;
    auVar172._0_4_ = fVar144 * auVar50._0_4_;
    fVar149 = auVar49._4_4_;
    auVar172._4_4_ = fVar149 * auVar50._4_4_;
    fVar151 = auVar49._8_4_;
    auVar172._8_4_ = fVar151 * auVar50._8_4_;
    fVar153 = auVar49._12_4_;
    auVar172._12_4_ = fVar153 * auVar50._12_4_;
    auVar90._8_4_ = 0x3f800000;
    auVar90._0_8_ = &DAT_3f8000003f800000;
    auVar90._12_4_ = 0x3f800000;
    auVar49 = vsubps_avx(auVar90,auVar172);
    fVar144 = fVar144 + fVar144 * auVar49._0_4_;
    fVar149 = fVar149 + fVar149 * auVar49._4_4_;
    fVar151 = fVar151 + fVar151 * auVar49._8_4_;
    fVar153 = fVar153 + fVar153 * auVar49._12_4_;
    auVar173._8_4_ = 0x7fffffff;
    auVar173._0_8_ = 0x7fffffff7fffffff;
    auVar173._12_4_ = 0x7fffffff;
    auVar49 = vandps_avx(auVar173,auVar50);
    auVar174._8_4_ = 0x219392ef;
    auVar174._0_8_ = 0x219392ef219392ef;
    auVar174._12_4_ = 0x219392ef;
    auVar49 = vcmpps_avx(auVar49,auVar174,2);
    uVar42 = CONCAT44(auVar52._4_4_,auVar52._0_4_);
    auVar175._0_8_ = uVar42 ^ 0x8000000080000000;
    auVar175._8_4_ = -auVar52._8_4_;
    auVar175._12_4_ = -auVar52._12_4_;
    auVar77 = vsubps_avx(auVar175,auVar86);
    auVar86 = vsubps_avx(auVar86,auVar52);
    auVar137._0_4_ = auVar77._0_4_ * fVar144;
    auVar137._4_4_ = auVar77._4_4_ * fVar149;
    auVar137._8_4_ = auVar77._8_4_ * fVar151;
    auVar137._12_4_ = auVar77._12_4_ * fVar153;
    auVar53._0_4_ = fVar144 * auVar86._0_4_;
    auVar53._4_4_ = fVar149 * auVar86._4_4_;
    auVar53._8_4_ = fVar151 * auVar86._8_4_;
    auVar53._12_4_ = fVar153 * auVar86._12_4_;
    auVar64._8_4_ = 0xff800000;
    auVar64._0_8_ = 0xff800000ff800000;
    auVar64._12_4_ = 0xff800000;
    auVar86 = vblendvps_avx(auVar137,auVar64,auVar49);
    auVar176._8_4_ = 0x7f800000;
    auVar176._0_8_ = 0x7f8000007f800000;
    auVar176._12_4_ = 0x7f800000;
    auVar77 = vblendvps_avx(auVar53,auVar176,auVar49);
    auVar138._0_4_ = fVar156 + auVar155._0_4_ * auVar86._0_4_;
    auVar138._4_4_ = fVar158 + auVar155._4_4_ * auVar86._4_4_;
    auVar138._8_4_ = fVar159 + auVar155._8_4_ * auVar86._8_4_;
    auVar138._12_4_ = fVar160 + auVar155._12_4_ * auVar86._12_4_;
    auVar49 = vcmpps_avx(auVar138,auVar79,6);
    auVar38._4_4_ = fVar104;
    auVar38._0_4_ = fVar101;
    auVar38._8_4_ = fVar105;
    auVar38._12_4_ = fVar106;
    auVar50 = vcmpps_avx(auVar138,auVar38,1);
    auVar49 = vandps_avx(auVar50,auVar49);
    auVar49 = vandps_avx(auVar63,auVar49);
    _local_3d0 = vblendvps_avx(auVar176,auVar86,auVar49);
    local_360._0_4_ = fVar156 + auVar155._0_4_ * auVar77._0_4_;
    local_360._4_4_ = fVar158 + auVar155._4_4_ * auVar77._4_4_;
    fStack_358 = fVar159 + auVar155._8_4_ * auVar77._8_4_;
    fStack_354 = fVar160 + auVar155._12_4_ * auVar77._12_4_;
    auVar49 = vcmpps_avx(_local_360,auVar79,6);
    auVar86 = vcmpps_avx(_local_360,auVar38,1);
    auVar49 = vandps_avx(auVar86,auVar49);
    auVar49 = vandps_avx(auVar63,auVar49);
    local_350 = vblendvps_avx(auVar64,auVar77,auVar49);
    local_2b0 = auVar78._0_4_;
    fStack_2ac = auVar78._4_4_;
    fStack_2a8 = auVar78._8_4_;
    fStack_2a4 = auVar78._12_4_;
    auVar49 = vrcpps_avx(auVar155);
    fVar144 = auVar49._0_4_;
    auVar108._0_4_ = auVar155._0_4_ * fVar144;
    fVar149 = auVar49._4_4_;
    auVar108._4_4_ = auVar155._4_4_ * fVar149;
    fVar151 = auVar49._8_4_;
    auVar108._8_4_ = auVar155._8_4_ * fVar151;
    fVar153 = auVar49._12_4_;
    auVar108._12_4_ = auVar155._12_4_ * fVar153;
    auVar49 = vsubps_avx(auVar90,auVar108);
    fVar144 = fVar144 + fVar144 * auVar49._0_4_;
    fVar149 = fVar149 + fVar149 * auVar49._4_4_;
    fVar151 = fVar151 + fVar151 * auVar49._8_4_;
    fVar153 = fVar153 + fVar153 * auVar49._12_4_;
    auVar109._0_4_ = auVar155._0_4_ * fVar143;
    auVar109._4_4_ = auVar155._4_4_ * fVar148;
    auVar109._8_4_ = auVar155._8_4_ * fVar150;
    auVar109._12_4_ = auVar155._12_4_ * fVar152;
    auVar124._0_4_ = fVar156 * fVar168;
    auVar124._4_4_ = fVar158 * fVar168;
    auVar124._8_4_ = fVar159 * fVar168;
    auVar124._12_4_ = fVar160 * fVar168;
    auVar49 = vsubps_avx(auVar109,auVar124);
    auVar125._0_4_ = auVar155._0_4_ * fVar70;
    auVar125._4_4_ = auVar155._4_4_ * fVar140;
    auVar125._8_4_ = auVar155._8_4_ * fVar141;
    auVar125._12_4_ = auVar155._12_4_ * fVar142;
    auVar146._0_4_ = fVar169 * fVar156;
    auVar146._4_4_ = fVar169 * fVar158;
    auVar146._8_4_ = fVar169 * fVar159;
    auVar146._12_4_ = fVar169 * fVar160;
    auVar86 = vsubps_avx(auVar125,auVar146);
    auVar147._0_4_ = auVar155._0_4_ * fVar61;
    auVar147._4_4_ = auVar155._4_4_ * fVar163;
    auVar147._8_4_ = auVar155._8_4_ * fVar165;
    auVar147._12_4_ = auVar155._12_4_ * fVar167;
    auVar91._0_4_ = fVar170 * fVar156;
    auVar91._4_4_ = fVar170 * fVar158;
    auVar91._8_4_ = fVar170 * fVar159;
    auVar91._12_4_ = fVar170 * fVar160;
    auVar77 = vsubps_avx(auVar147,auVar91);
    auVar92._0_4_ =
         auVar49._0_4_ * auVar49._0_4_ +
         auVar86._0_4_ * auVar86._0_4_ + auVar77._0_4_ * auVar77._0_4_;
    auVar92._4_4_ =
         auVar49._4_4_ * auVar49._4_4_ +
         auVar86._4_4_ * auVar86._4_4_ + auVar77._4_4_ * auVar77._4_4_;
    auVar92._8_4_ =
         auVar49._8_4_ * auVar49._8_4_ +
         auVar86._8_4_ * auVar86._8_4_ + auVar77._8_4_ * auVar77._8_4_;
    auVar92._12_4_ =
         auVar49._12_4_ * auVar49._12_4_ +
         auVar86._12_4_ * auVar86._12_4_ + auVar77._12_4_ * auVar77._12_4_;
    auVar110._0_4_ = (float)local_460._0_4_ * (float)local_460._0_4_ * fVar161;
    auVar110._4_4_ = (float)local_460._4_4_ * (float)local_460._4_4_ * fVar162;
    auVar110._8_4_ = fStack_458 * fStack_458 * fVar164;
    auVar110._12_4_ = fStack_454 * fStack_454 * fVar166;
    auVar49 = vcmpps_avx(auVar92,auVar110,1);
    auVar111._0_4_ = fVar144 * -fVar156;
    auVar111._4_4_ = fVar149 * -fVar158;
    auVar111._8_4_ = fVar151 * -fVar159;
    auVar111._12_4_ = fVar153 * -fVar160;
    auVar86 = vblendvps_avx(auVar176,auVar111,auVar49);
    local_2a0._0_4_ = auVar76._0_4_;
    local_2a0._4_4_ = auVar76._4_4_;
    fStack_298 = auVar76._8_4_;
    fStack_294 = auVar76._12_4_;
    fVar156 = fVar99 * (float)local_2a0._0_4_ + local_2b0 * fVar98 + auVar51._0_4_ * fVar89;
    fVar158 = fVar177 * (float)local_2a0._4_4_ + fStack_2ac * fVar100 + auVar51._4_4_ * fVar74;
    fVar159 = fVar16 * fStack_298 + fStack_2a8 * fVar15 + auVar51._8_4_ * fVar14;
    fVar160 = fVar20 * fStack_294 + fStack_2a4 * fVar19 + auVar51._12_4_ * fVar18;
    auVar49 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar63);
    auVar50 = vblendvps_avx(auVar176,auVar86,auVar49);
    auVar93._0_4_ = auVar155._0_4_ * (float)local_2a0._0_4_;
    auVar93._4_4_ = auVar155._4_4_ * (float)local_2a0._4_4_;
    auVar93._8_4_ = auVar155._8_4_ * fStack_298;
    auVar93._12_4_ = auVar155._12_4_ * fStack_294;
    auVar86._0_4_ = auVar155._0_4_ * local_2b0;
    auVar86._4_4_ = auVar155._4_4_ * fStack_2ac;
    auVar86._8_4_ = auVar155._8_4_ * fStack_2a8;
    auVar86._12_4_ = auVar155._12_4_ * fStack_2a4;
    auVar65._0_4_ = auVar155._0_4_ * auVar51._0_4_;
    auVar65._4_4_ = auVar155._4_4_ * auVar51._4_4_;
    auVar65._8_4_ = auVar155._8_4_ * auVar51._8_4_;
    auVar65._12_4_ = auVar155._12_4_ * auVar51._12_4_;
    auVar112._0_4_ = fVar168 * fVar156;
    auVar112._4_4_ = fVar168 * fVar158;
    auVar112._8_4_ = fVar168 * fVar159;
    auVar112._12_4_ = fVar168 * fVar160;
    auVar49 = vsubps_avx(auVar93,auVar112);
    auVar113._0_4_ = fVar169 * fVar156;
    auVar113._4_4_ = fVar169 * fVar158;
    auVar113._8_4_ = fVar169 * fVar159;
    auVar113._12_4_ = fVar169 * fVar160;
    auVar86 = vsubps_avx(auVar86,auVar113);
    auVar114._0_4_ = fVar170 * fVar156;
    auVar114._4_4_ = fVar170 * fVar158;
    auVar114._8_4_ = fVar170 * fVar159;
    auVar114._12_4_ = fVar170 * fVar160;
    auVar77 = vsubps_avx(auVar65,auVar114);
    auVar66._0_4_ =
         auVar49._0_4_ * auVar49._0_4_ +
         auVar86._0_4_ * auVar86._0_4_ + auVar77._0_4_ * auVar77._0_4_;
    auVar66._4_4_ =
         auVar49._4_4_ * auVar49._4_4_ +
         auVar86._4_4_ * auVar86._4_4_ + auVar77._4_4_ * auVar77._4_4_;
    auVar66._8_4_ =
         auVar49._8_4_ * auVar49._8_4_ +
         auVar86._8_4_ * auVar86._8_4_ + auVar77._8_4_ * auVar77._8_4_;
    auVar66._12_4_ =
         auVar49._12_4_ * auVar49._12_4_ +
         auVar86._12_4_ * auVar86._12_4_ + auVar77._12_4_ * auVar77._12_4_;
    auVar49 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar63);
    auVar94._0_4_ = fVar161 * auVar48._0_4_ * auVar48._0_4_;
    auVar94._4_4_ = fVar162 * auVar48._4_4_ * auVar48._4_4_;
    auVar94._8_4_ = fVar164 * auVar48._8_4_ * auVar48._8_4_;
    auVar94._12_4_ = fVar166 * auVar48._12_4_ * auVar48._12_4_;
    auVar86 = vcmpps_avx(auVar66,auVar94,1);
    auVar54._0_4_ = fVar144 * -fVar156;
    auVar54._4_4_ = fVar149 * -fVar158;
    auVar54._8_4_ = fVar151 * -fVar159;
    auVar54._12_4_ = fVar153 * -fVar160;
    auVar86 = vblendvps_avx(auVar176,auVar54,auVar86);
    auVar49 = vblendvps_avx(auVar176,auVar86,auVar49);
    auVar79 = vminps_avx(auVar50,auVar49);
    auVar86 = vmaxps_avx(auVar50,auVar49);
    auVar48 = vminps_avx(_local_3d0,auVar79);
    auVar77 = vcmpps_avx(auVar48,auVar79,0);
    auVar49 = vcmpps_avx(auVar176,auVar86,0);
    auVar115._8_4_ = 0xff800000;
    auVar115._0_8_ = 0xff800000ff800000;
    auVar115._12_4_ = 0xff800000;
    auVar49 = vblendvps_avx(auVar86,auVar115,auVar49);
    auVar86 = vcmpps_avx(auVar176,auVar79,0);
    auVar86 = vblendvps_avx(auVar79,auVar115,auVar86);
    auVar86 = vblendvps_avx(auVar86,auVar49,auVar77);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar80._4_4_ = uVar1;
    auVar80._0_4_ = uVar1;
    auVar80._8_4_ = uVar1;
    auVar80._12_4_ = uVar1;
    auVar87._0_4_ = fVar62 + auVar48._0_4_;
    auVar87._4_4_ = fVar71 + auVar48._4_4_;
    auVar87._8_4_ = fVar73 + auVar48._8_4_;
    auVar87._12_4_ = fVar75 + auVar48._12_4_;
    auVar49 = vcmpps_avx(auVar80,auVar87,2);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar116._4_4_ = uVar1;
    auVar116._0_4_ = uVar1;
    auVar116._8_4_ = uVar1;
    auVar116._12_4_ = uVar1;
    auVar77 = vcmpps_avx(auVar87,auVar116,2);
    auVar49 = vandps_avx(auVar49,auVar77);
    _local_2a0 = vmaxps_avx(local_350,auVar86);
    auVar86 = vcmpps_avx(auVar176,auVar48,4);
    local_2f0 = vandps_avx(auVar49,auVar86);
    local_380._0_4_ = fVar62 + local_2a0._0_4_;
    local_380._4_4_ = fVar71 + local_2a0._4_4_;
    local_380._8_4_ = fVar73 + local_2a0._8_4_;
    local_380._12_4_ = fVar75 + local_2a0._12_4_;
    auVar49 = vcmpps_avx(auVar80,local_380,2);
    auVar86 = vcmpps_avx(local_380,auVar116,2);
    auVar49 = vandps_avx(auVar49,auVar86);
    auVar86 = vandps_avx(auVar63,local_2f0);
    auVar77 = vcmpps_avx(auVar115,_local_2a0,4);
    auVar77 = vandps_avx(auVar63,auVar77);
    local_390 = vandps_avx(auVar49,auVar77);
    auVar49 = vorps_avx(auVar86,local_390);
    uVar40 = vmovmskps_avx(auVar49);
    if (uVar40 != 0) {
      auVar77 = vblendvps_avx(_local_2a0,auVar48,auVar86);
      auVar79 = vblendvps_avx(_local_360,auVar138,auVar86);
      auVar39._4_4_ = fVar104;
      auVar39._0_4_ = fVar101;
      auVar39._8_4_ = fVar105;
      auVar39._12_4_ = fVar106;
      auVar49 = vrcpps_avx(auVar39);
      fVar156 = auVar49._0_4_;
      auVar88._0_4_ = fVar101 * fVar156;
      fVar158 = auVar49._4_4_;
      auVar88._4_4_ = fVar104 * fVar158;
      fVar159 = auVar49._8_4_;
      auVar88._8_4_ = fVar105 * fVar159;
      fVar160 = auVar49._12_4_;
      auVar88._12_4_ = fVar106 * fVar160;
      auVar139._8_4_ = 0x3f800000;
      auVar139._0_8_ = &DAT_3f8000003f800000;
      auVar139._12_4_ = 0x3f800000;
      auVar49 = vsubps_avx(auVar139,auVar88);
      fVar156 = fVar156 + fVar156 * auVar49._0_4_;
      fVar158 = fVar158 + fVar158 * auVar49._4_4_;
      fVar159 = fVar159 + fVar159 * auVar49._8_4_;
      fVar160 = fVar160 + fVar160 * auVar49._12_4_;
      local_460._0_4_ = fVar101 * fVar72 * (float)local_460._0_4_;
      local_460._4_4_ = fVar104 * fVar13 * (float)local_460._4_4_;
      fStack_458 = fVar105 * fVar17 * fStack_458;
      fStack_454 = fVar106 * fVar21 * fStack_454;
      local_3e0 = fVar99 * (float)local_460._0_4_;
      fStack_3dc = fVar177 * (float)local_460._4_4_;
      fStack_3d8 = fVar16 * fStack_458;
      fStack_3d4 = fVar20 * fStack_454;
      auVar49 = vcmpps_avx(auVar77,_local_3d0,0);
      auVar86 = vcmpps_avx(auVar77,local_350,0);
      auVar49 = vorps_avx(auVar49,auVar86);
      auVar49 = vandps_avx(auVar63,auVar49);
      auVar86 = vcmpps_avx(auVar77,auVar50,0);
      auVar86 = vandps_avx(auVar63,auVar86);
      fVar72 = auVar77._0_4_;
      fVar17 = auVar77._4_4_;
      fVar21 = auVar77._8_4_;
      fVar101 = auVar77._12_4_;
      auVar95._0_4_ = local_3e0 + (float)local_230._0_4_ * (fVar168 * fVar72 + fVar143);
      auVar95._4_4_ = fStack_3dc + (float)local_230._4_4_ * (fVar168 * fVar17 + fVar148);
      auVar95._8_4_ = fStack_3d8 + fStack_228 * (fVar168 * fVar21 + fVar150);
      auVar95._12_4_ = fStack_3d4 + fStack_224 * (fVar168 * fVar101 + fVar152);
      fStack_2cc = fStack_2bc * fVar177;
      local_2d0 = local_2c0 * fVar99;
      fStack_2c8 = fStack_2b8 * fVar16;
      fStack_2c4 = fStack_2b4 * fVar20;
      fVar13 = auVar79._0_4_;
      auVar117._0_4_ = local_2c0 * fVar99 * fVar13;
      fVar99 = auVar79._4_4_;
      auVar117._4_4_ = fStack_2bc * fVar177 * fVar99;
      fVar177 = auVar79._8_4_;
      auVar117._8_4_ = fStack_2b8 * fVar16 * fVar177;
      fVar104 = auVar79._12_4_;
      auVar117._12_4_ = fStack_2b4 * fVar20 * fVar104;
      auVar63 = vsubps_avx(auVar95,auVar117);
      local_1a0._0_8_ = local_220._0_8_ ^ 0x8000000080000000;
      local_1a0._8_4_ = -fVar16;
      local_1a0._12_4_ = -fVar20;
      auVar77 = vblendvps_avx(local_220,local_1a0,auVar86);
      local_260 = vblendvps_avx(auVar77,auVar63,auVar49);
      fStack_2ac = fVar100 * (float)local_460._4_4_;
      local_2b0 = fVar98 * (float)local_460._0_4_;
      fStack_2a8 = fVar15 * fStack_458;
      fStack_2a4 = fVar19 * fStack_454;
      auVar118._0_4_ =
           fVar98 * (float)local_460._0_4_ + (float)local_230._0_4_ * (fVar70 + fVar72 * fVar169);
      auVar118._4_4_ =
           fVar100 * (float)local_460._4_4_ + (float)local_230._4_4_ * (fVar140 + fVar17 * fVar169);
      auVar118._8_4_ = fVar15 * fStack_458 + fStack_228 * (fVar141 + fVar21 * fVar169);
      auVar118._12_4_ = fVar19 * fStack_454 + fStack_224 * (fVar142 + fVar101 * fVar169);
      fStack_2dc = fVar100 * fStack_2bc;
      local_2e0 = fVar98 * local_2c0;
      fStack_2d8 = fVar15 * fStack_2b8;
      fStack_2d4 = fVar19 * fStack_2b4;
      auVar126._0_4_ = fVar13 * fVar98 * local_2c0;
      auVar126._4_4_ = fVar99 * fVar100 * fStack_2bc;
      auVar126._8_4_ = fVar177 * fVar15 * fStack_2b8;
      auVar126._12_4_ = fVar104 * fVar19 * fStack_2b4;
      auVar63 = vsubps_avx(auVar118,auVar126);
      local_1c0._0_8_ = local_310._0_8_ ^ 0x8000000080000000;
      local_1c0._8_4_ = -fVar15;
      local_1c0._12_4_ = -fVar19;
      auVar77 = vblendvps_avx(local_310,local_1c0,auVar86);
      local_250 = vblendvps_avx(auVar77,auVar63,auVar49);
      local_2c0 = fVar89 * local_2c0;
      fStack_2bc = fVar74 * fStack_2bc;
      fStack_2b8 = fVar14 * fStack_2b8;
      fStack_2b4 = fVar18 * fStack_2b4;
      local_190 = fVar89 * (float)local_460._0_4_;
      fStack_18c = fVar74 * (float)local_460._4_4_;
      fStack_188 = fVar14 * fStack_458;
      fStack_184 = fVar18 * fStack_454;
      auVar81._0_4_ =
           fVar89 * (float)local_460._0_4_ + (float)local_230._0_4_ * (fVar61 + fVar72 * fVar170);
      auVar81._4_4_ =
           fVar74 * (float)local_460._4_4_ + (float)local_230._4_4_ * (fVar163 + fVar17 * fVar170);
      auVar81._8_4_ = fVar14 * fStack_458 + fStack_228 * (fVar165 + fVar21 * fVar170);
      auVar81._12_4_ = fVar18 * fStack_454 + fStack_224 * (fVar167 + fVar101 * fVar170);
      local_1d0._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
      local_1d0._8_4_ = -fVar14;
      local_1d0._12_4_ = -fVar18;
      auVar127._0_4_ = fVar13 * local_2c0;
      auVar127._4_4_ = fVar99 * fStack_2bc;
      auVar127._8_4_ = fVar177 * fStack_2b8;
      auVar127._12_4_ = fVar104 * fStack_2b4;
      auVar77 = vblendvps_avx(local_320,local_1d0,auVar86);
      auVar63 = vsubps_avx(auVar81,auVar127);
      local_240 = vblendvps_avx(auVar77,auVar63,auVar49);
      auVar55._8_4_ = 0x3f800000;
      auVar55._0_8_ = &DAT_3f8000003f800000;
      auVar55._12_4_ = 0x3f800000;
      local_1b0 = vandnps_avx(auVar86,auVar55);
      auVar67._0_4_ = fVar13 * fVar156;
      auVar67._4_4_ = fVar99 * fVar158;
      auVar67._8_4_ = fVar177 * fVar159;
      auVar67._12_4_ = fVar104 * fVar160;
      local_290 = vblendvps_avx(local_1b0,auVar67,auVar49);
      local_270._0_4_ = fVar72 + fVar62;
      local_270._4_4_ = fVar17 + fVar71;
      local_270._8_4_ = fVar21 + fVar73;
      local_270._12_4_ = fVar101 + fVar75;
      local_280 = ZEXT816(0) << 0x20;
      uVar41 = 1 << ((byte)k & 0x1f);
      uVar45 = (ulong)(uVar40 & 0xff);
      uVar42 = (ulong)((uVar41 & 0xf) << 4);
      lVar43 = (long)((int)uVar41 >> 4) * 0x10;
      auVar131 = ZEXT1664(local_310);
      auVar135 = ZEXT1664(local_320);
      fVar89 = fVar168;
      fVar98 = fVar168;
      fVar99 = fVar168;
      local_368 = line;
      local_300 = fVar168;
      fStack_2fc = fVar168;
      fStack_2f8 = fVar168;
      fStack_2f4 = fVar168;
      do {
        uVar12 = 0;
        if (uVar45 != 0) {
          for (; (uVar45 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar40 = *(uint *)(local_210 + uVar12 * 4);
        pGVar8 = (pSVar7->geometries).items[uVar40].ptr;
        local_3c0.ray = (RTCRayN *)ray;
        if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar45 = uVar45 ^ 1L << (uVar12 & 0x3f);
          bVar46 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar46 = false;
        }
        else {
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_120 = *(undefined4 *)(local_290 + uVar12 * 4);
          local_100 = *(undefined4 *)(local_280 + uVar12 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_270 + uVar12 * 4);
          local_3c0.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar40),0);
          local_e0._4_4_ = (local_368->primIDs).field_0.i[uVar12];
          uVar2 = *(undefined4 *)(local_260 + uVar12 * 4);
          uVar3 = *(undefined4 *)(local_250 + uVar12 * 4);
          local_160._4_4_ = uVar3;
          local_160._0_4_ = uVar3;
          local_160._8_4_ = uVar3;
          local_160._12_4_ = uVar3;
          local_160._16_4_ = uVar3;
          local_160._20_4_ = uVar3;
          local_160._24_4_ = uVar3;
          local_160._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(local_240 + uVar12 * 4);
          local_140._4_4_ = uVar3;
          local_140._0_4_ = uVar3;
          local_140._8_4_ = uVar3;
          local_140._12_4_ = uVar3;
          local_140._16_4_ = uVar3;
          local_140._20_4_ = uVar3;
          local_140._24_4_ = uVar3;
          local_140._28_4_ = uVar3;
          local_180[0] = (RTCHitN)(char)uVar2;
          local_180[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar2;
          local_180[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar2;
          local_180[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar2;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar2;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar2;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar2;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar2;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          local_e0._0_4_ = local_e0._4_4_;
          local_e0._8_4_ = local_e0._4_4_;
          local_e0._12_4_ = local_e0._4_4_;
          local_e0._16_4_ = local_e0._4_4_;
          local_e0._20_4_ = local_e0._4_4_;
          local_e0._24_4_ = local_e0._4_4_;
          local_e0._28_4_ = local_e0._4_4_;
          local_c0 = local_b0;
          auVar82 = vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
          uStack_9c = (local_3c0.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_3c0.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_400 = *(undefined8 *)(mm_lookupmask_ps + uVar42);
          uStack_3f8 = *(undefined8 *)(mm_lookupmask_ps + uVar42 + 8);
          local_3f0 = *(undefined8 *)(mm_lookupmask_ps + lVar43);
          uStack_3e8 = *(undefined8 *)(mm_lookupmask_ps + lVar43 + 8);
          local_3c0.valid = (int *)&local_400;
          local_3c0.geometryUserPtr = pGVar8->userPtr;
          local_3c0.hit = local_180;
          local_3c0.N = 8;
          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_200 = auVar82;
            (*pGVar8->occlusionFilterN)(&local_3c0);
            auVar135 = ZEXT1664(local_320);
            auVar131 = ZEXT1664(local_310);
            auVar82 = local_200;
            fVar70 = (float)local_330._0_4_;
            fVar140 = (float)local_330._4_4_;
            fVar141 = fStack_328;
            fVar142 = fStack_324;
            fVar61 = (float)local_340._0_4_;
            fVar163 = (float)local_340._4_4_;
            fVar165 = fStack_338;
            fVar167 = fStack_334;
            fVar168 = local_300;
            fVar89 = fStack_2fc;
            fVar98 = fStack_2f8;
            fVar99 = fStack_2f4;
          }
          auVar77 = ZEXT816(0) << 0x40;
          auVar30._8_8_ = uStack_3f8;
          auVar30._0_8_ = local_400;
          auVar49 = vpcmpeqd_avx(auVar77,auVar30);
          auVar34._8_8_ = uStack_3e8;
          auVar34._0_8_ = local_3f0;
          auVar86 = vpcmpeqd_avx(auVar77,auVar34);
          auVar57._16_16_ = auVar86;
          auVar57._0_16_ = auVar49;
          auVar57 = auVar82 & ~auVar57;
          if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar57 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar57 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar57 >> 0x7f,0) == '\0') &&
                (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar57 >> 0xbf,0) == '\0') &&
              (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar57[0x1f]) {
            auVar58._0_4_ = auVar49._0_4_ ^ auVar82._0_4_;
            auVar58._4_4_ = auVar49._4_4_ ^ auVar82._4_4_;
            auVar58._8_4_ = auVar49._8_4_ ^ auVar82._8_4_;
            auVar58._12_4_ = auVar49._12_4_ ^ auVar82._12_4_;
            auVar58._16_4_ = auVar86._0_4_ ^ auVar82._16_4_;
            auVar58._20_4_ = auVar86._4_4_ ^ auVar82._20_4_;
            auVar58._24_4_ = auVar86._8_4_ ^ auVar82._24_4_;
            auVar58._28_4_ = auVar86._12_4_ ^ auVar82._28_4_;
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              local_200 = auVar82;
              (*p_Var11)(&local_3c0);
              auVar77 = ZEXT816(0) << 0x40;
              auVar135 = ZEXT1664(local_320);
              auVar131 = ZEXT1664(local_310);
              fVar70 = (float)local_330._0_4_;
              fVar140 = (float)local_330._4_4_;
              fVar141 = fStack_328;
              fVar142 = fStack_324;
              fVar61 = (float)local_340._0_4_;
              fVar163 = (float)local_340._4_4_;
              fVar165 = fStack_338;
              fVar167 = fStack_334;
              fVar168 = local_300;
              fVar89 = fStack_2fc;
              fVar98 = fStack_2f8;
              fVar99 = fStack_2f4;
              auVar82 = local_200;
            }
            auVar31._8_8_ = uStack_3f8;
            auVar31._0_8_ = local_400;
            auVar49 = vpcmpeqd_avx(auVar77,auVar31);
            auVar35._8_8_ = uStack_3e8;
            auVar35._0_8_ = local_3f0;
            auVar86 = vpcmpeqd_avx(auVar77,auVar35);
            auVar68._16_16_ = auVar86;
            auVar68._0_16_ = auVar49;
            auVar58._0_4_ = auVar49._0_4_ ^ auVar82._0_4_;
            auVar58._4_4_ = auVar49._4_4_ ^ auVar82._4_4_;
            auVar58._8_4_ = auVar49._8_4_ ^ auVar82._8_4_;
            auVar58._12_4_ = auVar49._12_4_ ^ auVar82._12_4_;
            auVar58._16_4_ = auVar86._0_4_ ^ auVar82._16_4_;
            auVar58._20_4_ = auVar86._4_4_ ^ auVar82._20_4_;
            auVar58._24_4_ = auVar86._8_4_ ^ auVar82._24_4_;
            auVar58._28_4_ = auVar86._12_4_ ^ auVar82._28_4_;
            auVar82._8_4_ = 0xff800000;
            auVar82._0_8_ = 0xff800000ff800000;
            auVar82._12_4_ = 0xff800000;
            auVar82._16_4_ = 0xff800000;
            auVar82._20_4_ = 0xff800000;
            auVar82._24_4_ = 0xff800000;
            auVar82._28_4_ = 0xff800000;
            auVar82 = vblendvps_avx(auVar82,*(undefined1 (*) [32])(local_3c0.ray + 0x100),auVar68);
            *(undefined1 (*) [32])(local_3c0.ray + 0x100) = auVar82;
          }
          bVar27 = (auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar28 = (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar26 = (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar25 = SUB321(auVar58 >> 0x7f,0) == '\0';
          bVar24 = (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar23 = SUB321(auVar58 >> 0xbf,0) == '\0';
          bVar22 = (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar47 = -1 < auVar58[0x1f];
          bVar46 = ((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) && bVar22) &&
                   bVar47;
          if (((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) && bVar22) &&
              bVar47) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
            uVar45 = uVar45 ^ 1L << (uVar12 & 0x3f);
          }
        }
      } while ((bVar46 != false) && (uVar45 != 0));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar56._4_4_ = uVar1;
      auVar56._0_4_ = uVar1;
      auVar56._8_4_ = uVar1;
      auVar56._12_4_ = uVar1;
      auVar86 = vcmpps_avx(local_380,auVar56,2);
      auVar49 = vandps_avx(local_390,local_2f0);
      auVar49 = vandps_avx(auVar49,auVar86);
      uVar40 = vmovmskps_avx(auVar49);
      if (uVar40 == 0) {
        return (bool)(bVar46 ^ 1U);
      }
      auVar77 = vcmpps_avx(auVar50,_local_2a0,0);
      auVar49 = vblendvps_avx(local_220,local_1a0,auVar77);
      auVar86 = vblendvps_avx(auVar131._0_16_,local_1c0,auVar77);
      auVar77 = vblendvps_avx(auVar135._0_16_,local_1d0,auVar77);
      auVar50 = vcmpps_avx(_local_2a0,_local_3d0,0);
      auVar63 = vcmpps_avx(_local_2a0,local_350,0);
      auVar50 = vorps_avx(auVar50,auVar63);
      fVar72 = local_2a0._0_4_;
      fVar74 = local_2a0._4_4_;
      fVar100 = local_2a0._8_4_;
      fVar177 = local_2a0._12_4_;
      auVar96._0_4_ = (float)local_230._0_4_ * (fVar143 + fVar168 * fVar72) + local_3e0;
      auVar96._4_4_ = (float)local_230._4_4_ * (fVar148 + fVar89 * fVar74) + fStack_3dc;
      auVar96._8_4_ = fStack_228 * (fVar150 + fVar98 * fVar100) + fStack_3d8;
      auVar96._12_4_ = fStack_224 * (fVar152 + fVar99 * fVar177) + fStack_3d4;
      auVar103._0_4_ = (float)local_230._0_4_ * (fVar70 + fVar169 * fVar72) + local_2b0;
      auVar103._4_4_ = (float)local_230._4_4_ * (fVar140 + fVar169 * fVar74) + fStack_2ac;
      auVar103._8_4_ = fStack_228 * (fVar141 + fVar169 * fVar100) + fStack_2a8;
      auVar103._12_4_ = fStack_224 * (fVar142 + fVar169 * fVar177) + fStack_2a4;
      auVar119._0_4_ = (float)local_230._0_4_ * (fVar61 + fVar170 * fVar72) + local_190;
      auVar119._4_4_ = (float)local_230._4_4_ * (fVar163 + fVar170 * fVar74) + fStack_18c;
      auVar119._8_4_ = fStack_228 * (fVar165 + fVar170 * fVar100) + fStack_188;
      auVar119._12_4_ = fStack_224 * (fVar167 + fVar170 * fVar177) + fStack_184;
      auVar128._0_4_ = (float)local_360._0_4_ * local_2d0;
      auVar128._4_4_ = (float)local_360._4_4_ * fStack_2cc;
      auVar128._8_4_ = fStack_358 * fStack_2c8;
      auVar128._12_4_ = fStack_354 * fStack_2c4;
      auVar63 = vsubps_avx(auVar96,auVar128);
      auVar129._0_4_ = (float)local_360._0_4_ * local_2e0;
      auVar129._4_4_ = (float)local_360._4_4_ * fStack_2dc;
      auVar129._8_4_ = fStack_358 * fStack_2d8;
      auVar129._12_4_ = fStack_354 * fStack_2d4;
      auVar79 = vsubps_avx(auVar103,auVar129);
      auVar130._0_4_ = (float)local_360._0_4_ * local_2c0;
      auVar130._4_4_ = (float)local_360._4_4_ * fStack_2bc;
      auVar130._8_4_ = fStack_358 * fStack_2b8;
      auVar130._12_4_ = fStack_354 * fStack_2b4;
      auVar48 = vsubps_avx(auVar119,auVar130);
      local_260 = vblendvps_avx(auVar49,auVar63,auVar50);
      local_250 = vblendvps_avx(auVar86,auVar79,auVar50);
      local_240 = vblendvps_avx(auVar77,auVar48,auVar50);
      auVar97._0_4_ = (float)local_360._0_4_ * fVar156;
      auVar97._4_4_ = (float)local_360._4_4_ * fVar158;
      auVar97._8_4_ = fStack_358 * fVar159;
      auVar97._12_4_ = fStack_354 * fVar160;
      local_290 = vblendvps_avx(local_1b0,auVar97,auVar50);
      auVar131 = ZEXT464(0) << 0x20;
      local_280 = ZEXT416(0) << 0x20;
      local_270 = local_380;
      uVar41 = 1 << ((byte)k & 0x1f);
      pSVar7 = context->scene;
      uVar45 = (ulong)(uVar40 & 0xff);
      uVar42 = (ulong)((uVar41 & 0xf) << 4);
      lVar43 = (long)((int)uVar41 >> 4) * 0x10;
      auVar135 = ZEXT864(0) << 0x20;
      do {
        uVar12 = 0;
        if (uVar45 != 0) {
          for (; (uVar45 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar40 = *(uint *)(local_210 + uVar12 * 4);
        pGVar8 = (pSVar7->geometries).items[uVar40].ptr;
        if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar45 = uVar45 ^ 1L << (uVar12 & 0x3f);
          bVar47 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar47 = false;
        }
        else {
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_120 = *(undefined4 *)(local_290 + uVar12 * 4);
          local_100 = *(undefined4 *)(local_280 + uVar12 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_270 + uVar12 * 4);
          local_3c0.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar40),0);
          uVar40 = (local_368->primIDs).field_0.i[uVar12];
          local_e0._4_4_ = uVar40;
          local_e0._0_4_ = uVar40;
          local_e0._8_4_ = uVar40;
          local_e0._12_4_ = uVar40;
          local_e0._16_4_ = uVar40;
          local_e0._20_4_ = uVar40;
          local_e0._24_4_ = uVar40;
          local_e0._28_4_ = uVar40;
          uVar2 = *(undefined4 *)(local_260 + uVar12 * 4);
          uVar3 = *(undefined4 *)(local_250 + uVar12 * 4);
          local_160._4_4_ = uVar3;
          local_160._0_4_ = uVar3;
          local_160._8_4_ = uVar3;
          local_160._12_4_ = uVar3;
          local_160._16_4_ = uVar3;
          local_160._20_4_ = uVar3;
          local_160._24_4_ = uVar3;
          local_160._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(local_240 + uVar12 * 4);
          local_140._4_4_ = uVar3;
          local_140._0_4_ = uVar3;
          local_140._8_4_ = uVar3;
          local_140._12_4_ = uVar3;
          local_140._16_4_ = uVar3;
          local_140._20_4_ = uVar3;
          local_140._24_4_ = uVar3;
          local_140._28_4_ = uVar3;
          local_180[0] = (RTCHitN)(char)uVar2;
          local_180[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar2;
          local_180[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar2;
          local_180[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar2;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar2;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar2;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar2;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar2;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          local_c0 = local_b0;
          auVar82 = vcmpps_avx(auVar135._0_32_,auVar135._0_32_,0xf);
          uStack_9c = (local_3c0.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_84 = auVar82._28_4_;
          uVar40 = uStack_84;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_3c0.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_400 = *(undefined8 *)(mm_lookupmask_ps + uVar42);
          uStack_3f8 = *(undefined8 *)(mm_lookupmask_ps + uVar42 + 8);
          local_3f0 = *(undefined8 *)(mm_lookupmask_ps + lVar43);
          uStack_3e8 = *(undefined8 *)(mm_lookupmask_ps + lVar43 + 8);
          local_3c0.valid = (int *)&local_400;
          local_3c0.geometryUserPtr = pGVar8->userPtr;
          local_3c0.hit = local_180;
          local_3c0.N = 8;
          local_3c0.ray = (RTCRayN *)ray;
          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar8->occlusionFilterN)(&local_3c0);
            auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar32._8_8_ = uStack_3f8;
          auVar32._0_8_ = local_400;
          auVar49 = vpcmpeqd_avx(auVar131._0_16_,auVar32);
          auVar36._8_8_ = uStack_3e8;
          auVar36._0_8_ = local_3f0;
          auVar86 = vpcmpeqd_avx(auVar131._0_16_,auVar36);
          auVar59._16_16_ = auVar86;
          auVar59._0_16_ = auVar49;
          auVar57 = auVar82 & ~auVar59;
          if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar57 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar57 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar57 >> 0x7f,0) == '\0') &&
                (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar57 >> 0xbf,0) == '\0') &&
              (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar57[0x1f]) {
            auVar60._0_4_ = auVar49._0_4_ ^ auVar82._0_4_;
            auVar60._4_4_ = auVar49._4_4_ ^ auVar82._4_4_;
            auVar60._8_4_ = auVar49._8_4_ ^ auVar82._8_4_;
            auVar60._12_4_ = auVar49._12_4_ ^ auVar82._12_4_;
            auVar60._16_4_ = auVar86._0_4_ ^ auVar82._16_4_;
            auVar60._20_4_ = auVar86._4_4_ ^ auVar82._20_4_;
            auVar60._24_4_ = auVar86._8_4_ ^ auVar82._24_4_;
            auVar60._28_4_ = auVar86._12_4_ ^ uVar40;
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var11)(&local_3c0);
              auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar33._8_8_ = uStack_3f8;
            auVar33._0_8_ = local_400;
            auVar49 = vpcmpeqd_avx(auVar131._0_16_,auVar33);
            auVar37._8_8_ = uStack_3e8;
            auVar37._0_8_ = local_3f0;
            auVar86 = vpcmpeqd_avx(auVar131._0_16_,auVar37);
            auVar69._16_16_ = auVar86;
            auVar69._0_16_ = auVar49;
            auVar60._0_4_ = auVar49._0_4_ ^ auVar82._0_4_;
            auVar60._4_4_ = auVar49._4_4_ ^ auVar82._4_4_;
            auVar60._8_4_ = auVar49._8_4_ ^ auVar82._8_4_;
            auVar60._12_4_ = auVar49._12_4_ ^ auVar82._12_4_;
            auVar60._16_4_ = auVar86._0_4_ ^ auVar82._16_4_;
            auVar60._20_4_ = auVar86._4_4_ ^ auVar82._20_4_;
            auVar60._24_4_ = auVar86._8_4_ ^ auVar82._24_4_;
            auVar60._28_4_ = auVar86._12_4_ ^ uVar40;
            auVar83._8_4_ = 0xff800000;
            auVar83._0_8_ = 0xff800000ff800000;
            auVar83._12_4_ = 0xff800000;
            auVar83._16_4_ = 0xff800000;
            auVar83._20_4_ = 0xff800000;
            auVar83._24_4_ = 0xff800000;
            auVar83._28_4_ = 0xff800000;
            auVar82 = vblendvps_avx(auVar83,*(undefined1 (*) [32])(local_3c0.ray + 0x100),auVar69);
            *(undefined1 (*) [32])(local_3c0.ray + 0x100) = auVar82;
          }
          bVar28 = (auVar60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar29 = (auVar60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar27 = (auVar60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar26 = SUB321(auVar60 >> 0x7f,0) == '\0';
          bVar25 = (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar24 = SUB321(auVar60 >> 0xbf,0) == '\0';
          bVar23 = (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar22 = -1 < auVar60[0x1f];
          bVar47 = ((((((bVar28 && bVar29) && bVar27) && bVar26) && bVar25) && bVar24) && bVar23) &&
                   bVar22;
          if (((((((bVar28 && bVar29) && bVar27) && bVar26) && bVar25) && bVar24) && bVar23) &&
              bVar22) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
            uVar45 = uVar45 ^ 1L << (uVar12 & 0x3f);
          }
        }
      } while ((bVar47 != false) && (uVar45 != 0));
      return (bool)(bVar46 ^ 1U | bVar47 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }